

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3OsCurrentTimeInt64(sqlite3_vfs *pVfs,sqlite3_int64 *pTimeOut)

{
  int iVar1;
  double in_RAX;
  double r;
  double local_18;
  
  if ((1 < pVfs->iVersion) &&
     (pVfs->xCurrentTimeInt64 != (_func_int_sqlite3_vfs_ptr_sqlite3_int64_ptr *)0x0)) {
    iVar1 = (*pVfs->xCurrentTimeInt64)(pVfs,pTimeOut);
    return iVar1;
  }
  local_18 = in_RAX;
  iVar1 = (*pVfs->xCurrentTime)(pVfs,&local_18);
  *pTimeOut = (long)(local_18 * 86400000.0);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsCurrentTimeInt64(sqlite3_vfs *pVfs, sqlite3_int64 *pTimeOut){
  int rc;
  /* IMPLEMENTATION-OF: R-49045-42493 SQLite will use the xCurrentTimeInt64()
  ** method to get the current date and time if that method is available
  ** (if iVersion is 2 or greater and the function pointer is not NULL) and
  ** will fall back to xCurrentTime() if xCurrentTimeInt64() is
  ** unavailable.
  */
  if( pVfs->iVersion>=2 && pVfs->xCurrentTimeInt64 ){
    rc = pVfs->xCurrentTimeInt64(pVfs, pTimeOut);
  }else{
    double r;
    rc = pVfs->xCurrentTime(pVfs, &r);
    *pTimeOut = (sqlite3_int64)(r*86400000.0);
  }
  return rc;
}